

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O2

string * QUtil::win_ansi_to_utf8(string *__return_storage_ptr__,string *val)

{
  byte bVar1;
  ulong uVar2;
  unsigned_short uVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar2 = val->_M_string_length;
  for (uVar4 = 0; uVar4 < uVar2; uVar4 = uVar4 + 1) {
    auVar5 = std::__cxx11::string::at((ulong)val);
    bVar1 = *auVar5._0_8_;
    uVar3 = (unsigned_short)bVar1;
    if ((char)bVar1 < -0x5f) {
      uVar3 = win_ansi_to_unicode[bVar1 & 0x3f];
    }
    toUTF8_abi_cxx11_(&local_50,(QUtil *)(ulong)uVar3,auVar5._8_8_);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
QUtil::win_ansi_to_utf8(std::string const& val)
{
    std::string result;
    size_t len = val.length();
    for (unsigned int i = 0; i < len; ++i) {
        unsigned char ch = static_cast<unsigned char>(val.at(i));
        unsigned short ch_short = ch;
        if ((ch >= 128) && (ch <= 160)) {
            ch_short = win_ansi_to_unicode[ch - 128];
        }
        result += QUtil::toUTF8(ch_short);
    }
    return result;
}